

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O2

Var Js::JavascriptMath::Subtract_DoubleHelper
              (Var subLeft,double dblRight,ScriptContext *scriptContext,JavascriptNumber *result)

{
  bool bVar1;
  Var pvVar2;
  double dVar3;
  
  bVar1 = TaggedInt::Is(subLeft);
  if (bVar1) {
    dVar3 = (double)(int)subLeft;
  }
  else {
    if ((ulong)subLeft >> 0x32 == 0) {
      pvVar2 = JavascriptNumber::ToVarMaybeInPlace(dblRight,scriptContext,result);
      pvVar2 = Subtract_Full(subLeft,pvVar2,scriptContext);
      return pvVar2;
    }
    dVar3 = JavascriptNumber::GetValue(subLeft);
  }
  pvVar2 = JavascriptNumber::ToVarMaybeInPlace(dVar3 - dblRight,scriptContext,result);
  return pvVar2;
}

Assistant:

Var inline JavascriptMath::Subtract_DoubleHelper(Var subLeft, double dblRight, ScriptContext* scriptContext, JavascriptNumber*result)
        {
            if (TaggedInt::Is(subLeft))
            {
                double sum =  TaggedInt::ToDouble(subLeft) - dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else if (JavascriptNumber::Is_NoTaggedIntCheck(subLeft))
            {
                double sum = JavascriptNumber::GetValue(subLeft) - dblRight;

                return JavascriptNumber::ToVarMaybeInPlace(sum, scriptContext, result);
            }
            else
            {
                Var aRight = JavascriptNumber::ToVarMaybeInPlace(dblRight, scriptContext, result);

                return Subtract_Full(subLeft, aRight, scriptContext);
            }
        }